

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkSelectFrom(Walker *pWalker,Select *p)

{
  int iVar1;
  SrcList_item *local_38;
  SrcList_item *pItem;
  int i;
  SrcList *pSrc;
  Select *p_local;
  Walker *pWalker_local;
  
  pItem._4_4_ = p->pSrc->nSrc;
  local_38 = p->pSrc->a;
  while( true ) {
    if (pItem._4_4_ < 1) {
      return 0;
    }
    if ((local_38->pSelect != (Select *)0x0) &&
       (iVar1 = sqlite3WalkSelect(pWalker,local_38->pSelect), iVar1 != 0)) break;
    if ((((byte)(local_38->fg).field_0x1 >> 2 & 1) != 0) &&
       (iVar1 = sqlite3WalkExprList(pWalker,(local_38->u1).pFuncArg), iVar1 != 0)) {
      return 2;
    }
    pItem._4_4_ = pItem._4_4_ + -1;
    local_38 = local_38 + 1;
  }
  return 2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelectFrom(Walker *pWalker, Select *p){
  SrcList *pSrc;
  int i;
  struct SrcList_item *pItem;

  pSrc = p->pSrc;
  assert( pSrc!=0 );
  for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
    if( pItem->pSelect && sqlite3WalkSelect(pWalker, pItem->pSelect) ){
      return WRC_Abort;
    }
    if( pItem->fg.isTabFunc
     && sqlite3WalkExprList(pWalker, pItem->u1.pFuncArg)
    ){
      return WRC_Abort;
    }
  }
  return WRC_Continue;
}